

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int uv_pipe_bind2(uv_pipe_t *handle,char *name,size_t namelen,uint flags)

{
  byte *pbVar1;
  int __fd;
  int iVar2;
  char *ptr;
  int *piVar3;
  size_t __n;
  sockaddr_un saddr;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  iVar2 = -0x16;
  if ((((namelen != 0) && (name != (char *)0x0)) && (flags < 2)) && (namelen < 0x6d || flags == 0))
  {
    __n = 0x6c;
    if (namelen < 0x6c) {
      __n = namelen;
    }
    if (((handle->io_watcher).fd < 0) && ((handle->flags & 3) == 0)) {
      if (*name == '\0') {
        ptr = (char *)0x0;
      }
      else {
        ptr = uv__strdup(name);
        if (ptr == (char *)0x0) {
          return -0xc;
        }
      }
      __fd = uv__socket(1,1,0);
      iVar2 = __fd;
      if (-1 < __fd) {
        uStack_48 = 0;
        uStack_42 = 0;
        uStack_58 = 0;
        uStack_50 = 0;
        local_4a = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_a8.sa_family = 0;
        local_a8.sa_data[0] = '\0';
        local_a8.sa_data[1] = '\0';
        local_a8.sa_data[2] = '\0';
        local_a8.sa_data[3] = '\0';
        local_a8.sa_data[4] = '\0';
        local_a8.sa_data[5] = '\0';
        local_a8.sa_data[6] = '\0';
        local_a8.sa_data[7] = '\0';
        local_a8.sa_data[8] = '\0';
        local_a8.sa_data[9] = '\0';
        local_a8.sa_data[10] = '\0';
        local_a8.sa_data[0xb] = '\0';
        local_a8.sa_data[0xc] = '\0';
        local_a8.sa_data[0xd] = '\0';
        memcpy(local_a8.sa_data,name,__n);
        local_a8.sa_family = 1;
        iVar2 = bind(__fd,&local_a8,0x6e);
        if (iVar2 == 0) {
          pbVar1 = (byte *)((long)&handle->flags + 1);
          *pbVar1 = *pbVar1 | 0x20;
          handle->pipe_fname = ptr;
          (handle->io_watcher).fd = __fd;
          return 0;
        }
        piVar3 = __errno_location();
        iVar2 = -0xd;
        if (*piVar3 != 2) {
          iVar2 = -*piVar3;
        }
        uv__close(__fd);
      }
      uv__free(ptr);
    }
  }
  return iVar2;
}

Assistant:

int uv_pipe_bind2(uv_pipe_t* handle,
                  const char* name,
                  size_t namelen,
                  unsigned int flags) {
  struct sockaddr_un saddr;
  char* pipe_fname;
  int sockfd;
  int err;

  pipe_fname = NULL;

  if (flags & ~UV_PIPE_NO_TRUNCATE)
    return UV_EINVAL;

  if (name == NULL)
    return UV_EINVAL;

  if (namelen == 0)
    return UV_EINVAL;

#ifndef __linux__
  /* Abstract socket namespace only works on Linux. */
  if (*name == '\0')
    return UV_EINVAL;
#endif

  if (flags & UV_PIPE_NO_TRUNCATE)
    if (namelen > sizeof(saddr.sun_path))
      return UV_EINVAL;

  /* Truncate long paths. Documented behavior. */
  if (namelen > sizeof(saddr.sun_path))
    namelen = sizeof(saddr.sun_path);

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return UV_EINVAL;

  if (uv__is_closing(handle))
    return UV_EINVAL;

  /* Make a copy of the file path unless it is an abstract socket.
   * We unlink the file later but abstract sockets disappear
   * automatically since they're not real file system entities.
   */
  if (*name != '\0') {
    pipe_fname = uv__strdup(name);
    if (pipe_fname == NULL)
      return UV_ENOMEM;
  }

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto err_socket;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  memcpy(&saddr.sun_path, name, namelen);
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, sizeof saddr)) {
    err = UV__ERR(errno);
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == UV_ENOENT)
      err = UV_EACCES;

    uv__close(sockfd);
    goto err_socket;
  }

  /* Success. */
  handle->flags |= UV_HANDLE_BOUND;
  handle->pipe_fname = pipe_fname; /* NULL or a strdup'ed copy. */
  handle->io_watcher.fd = sockfd;
  return 0;

err_socket:
  uv__free(pipe_fname);
  return err;
}